

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O0

int32 nextword(char *line,char *delim,char **word,char *delimfound)

{
  bool bVar1;
  char *local_40;
  char *w;
  char *d;
  char *delimfound_local;
  char **word_local;
  char *delim_local;
  char *line_local;
  
  for (local_40 = line; w = delim, *local_40 != '\0'; local_40 = local_40 + 1) {
    while( true ) {
      bVar1 = false;
      if (*w != '\0') {
        bVar1 = *w != *local_40;
      }
      if (!bVar1) break;
      w = w + 1;
    }
    if (*w == '\0') break;
  }
  if (*local_40 == '\0') {
    line_local._4_4_ = -1;
  }
  else {
    *word = local_40;
    do {
      local_40 = local_40 + 1;
      w = delim;
      if (*local_40 == '\0') break;
      while( true ) {
        bVar1 = false;
        if (*w != '\0') {
          bVar1 = *w != *local_40;
        }
        if (!bVar1) break;
        w = w + 1;
      }
    } while (*w == '\0');
    *delimfound = *local_40;
    *local_40 = '\0';
    line_local._4_4_ = (int)local_40 - (int)*word;
  }
  return line_local._4_4_;
}

Assistant:

int32
nextword(char *line, const char *delim, char **word, char *delimfound)
{
    const char *d;
    char *w;

    /* Skip past any preceding delimiters */
    for (w = line; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (!*d)
            break;
    }
    if (!*w)
        return -1;

    *word = w;                  /* Beginning of word */

    /* Skip until first delimiter char */
    for (w++; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (*d)
            break;
    }

    /* Replace delimiter with NULL char, but return the original first */
    *delimfound = *w;
    *w = '\0';

    return (w - *word);
}